

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# condition.cpp
# Opt level: O0

void __thiscall embree::ConditionSys::ConditionSys(ConditionSys *this)

{
  int iVar1;
  pthread_cond_t *__cond;
  runtime_error *this_00;
  undefined8 *in_RDI;
  
  __cond = (pthread_cond_t *)::operator_new(0x30);
  iVar1 = pthread_cond_init(__cond,(pthread_condattr_t *)0x0);
  if (iVar1 != 0) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"pthread_cond_init failed");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  *in_RDI = __cond;
  return;
}

Assistant:

ConditionSys::ConditionSys () { 
    cond = new ConditionImplementation; 
  }